

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O2

AbstractionResult * __thiscall
Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>
          (Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *__return_storage_ptr__,Kernel *this,TermSpec *au,TermSpec *t1)

{
  int iVar1;
  RobSubstitution *pRVar2;
  TermList TVar3;
  long lVar4;
  ulong uVar5;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar6;
  __uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  *p_Var7;
  Value VVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:119:60),_Kernel::TermSpec>_>
  it;
  UnificationConstraint items;
  UnificationConstraint items_00;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
  *pDVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Self this_00;
  undefined8 uVar16;
  Self SVar17;
  bool bVar18;
  uint uVar19;
  uint args;
  TermSpec *pTVar20;
  TermList *pTVar21;
  TermList TVar22;
  int iVar23;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *t_;
  anon_class_56_7_29367afc *paVar24;
  Self this_01;
  mp_limb_t *pmVar25;
  byte bVar26;
  TermSpec TVar27;
  TermSpec outer;
  TermSpec elem;
  anon_class_16_2_ef36fe0a p;
  TermSpec args_1;
  TermSpec args_2;
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_> sig;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  unify;
  anon_class_8_1_15ee404b equalIf;
  anon_class_56_7_29367afc curSumCanUnify;
  Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> todo;
  Value local_2d0;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  constr;
  Numeral curSum;
  anon_class_8_1_ba1d7831 constraint;
  anon_class_8_1_3fcf64f2 cTerm;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curNegSummands;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curPosSummands;
  Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  shieldedVars;
  Option<Kernel::UnificationConstraint> local_240;
  anon_class_16_2_6c5ac959 toConstr;
  undefined4 uStack_1e4;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_1e0;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_1d0;
  anon_class_16_2_0971476b sum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  _diff;
  EqualIf local_1a0;
  undefined1 local_180 [64];
  EqualIf local_140;
  EqualIf local_120;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> local_100;
  UnificationConstraint local_d0;
  UnificationConstraint local_a0;
  TermSpec local_70;
  TermSpec local_60;
  TermSpec local_50;
  TermSpec local_40;
  
  equalIf.sortsUnif = &local_240;
  local_240.super_OptionBase<Kernel::UnificationConstraint>._isSome = false;
  constraint.sig = &sig;
  cTerm.au = (AbstractingUnifier *)this;
  if (((au->term)._content & 3) == 0) {
    pRVar2 = *(RobSubstitution **)this;
    TVar27 = TermSpec::sort(au);
    curSumCanUnify.curSum._0_4_ = (undefined4)TVar27.term._content;
    curSumCanUnify.curSum._4_4_ = TVar27.term._content._4_4_;
    curSumCanUnify.curNegSummands._0_4_ = TVar27.index;
    pTVar20 = RobSubstitution::derefBound(pRVar2,(TermSpec *)&curSumCanUnify);
    TVar3._content = (pTVar20->term)._content;
    if ((TVar3._content & 1) == 0) {
      pTVar21 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      if (TVar3._content != pTVar21->_content) goto LAB_004be971;
    }
    else {
      iVar23 = pTVar20->index;
      pTVar21 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      TermSpec::TermSpec(&local_40,(TermList)pTVar21->_content,0);
      TVar22 = AtomicSort::superSort();
      TermSpec::TermSpec(&local_50,TVar22,0);
      curSumCanUnify.curSum._4_4_ = (undefined4)local_50.term._content;
      curSumCanUnify.curNegSummands._0_4_ = (int)(local_50.term._content >> 0x20);
      curSumCanUnify.curNegSummands._4_4_ = local_50.index;
      curSumCanUnify.curPosSummands._0_4_ = local_50._12_4_;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._28_8_ =
           CONCAT44(curSumCanUnify.curSum._4_4_,curSumCanUnify.curSum._0_4_);
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._36_8_ =
           CONCAT44(curSumCanUnify.curNegSummands._4_4_,(int)curSumCanUnify.curNegSummands);
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._44_4_ =
           curSumCanUnify.curPosSummands._0_4_;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t2.term._content =
           (TermList)(TermList)local_40.term._content;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t2.index =
           local_40.index;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._isSome = true;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t1.term._content =
           (TermList)TVar3._content;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t1.index = iVar23;
    }
  }
  if (((t1->term)._content & 3) == 0) {
    pRVar2 = *(RobSubstitution **)this;
    TVar27 = TermSpec::sort(t1);
    curSumCanUnify.curSum._0_4_ = (undefined4)TVar27.term._content;
    curSumCanUnify.curSum._4_4_ = TVar27.term._content._4_4_;
    curSumCanUnify.curNegSummands._0_4_ = TVar27.index;
    pTVar20 = RobSubstitution::derefBound(pRVar2,(TermSpec *)&curSumCanUnify);
    TVar3._content = (pTVar20->term)._content;
    if ((TVar3._content & 1) == 0) {
      pTVar21 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      if (TVar3._content != pTVar21->_content) {
LAB_004be971:
        pDVar13 = &(__return_storage_ptr__->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xf] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x10] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x11] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x12] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x13] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x14] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x15] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x16] = '\0';
        pDVar13 = &(__return_storage_ptr__->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x17] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x18] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x19] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1a] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1b] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1c] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1d] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1e] = '\0';
        *(undefined8 *)
         &(__return_storage_ptr__->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             = 0;
        pDVar13 = &(__return_storage_ptr__->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[7] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[8] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[9] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[10] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xb] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xc] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xd] = '\0';
        (pDVar13->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xe] = '\0';
        *(undefined4 *)
         ((__return_storage_ptr__->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ._content + 0x1f) = 0;
        return __return_storage_ptr__;
      }
    }
    else {
      iVar23 = pTVar20->index;
      pTVar21 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      TermSpec::TermSpec(&local_60,(TermList)pTVar21->_content,0);
      TVar22 = AtomicSort::superSort();
      TermSpec::TermSpec(&local_70,TVar22,0);
      curSumCanUnify.curSum._4_4_ = (undefined4)local_70.term._content;
      curSumCanUnify.curNegSummands._0_4_ = (int)(local_70.term._content >> 0x20);
      curSumCanUnify.curNegSummands._4_4_ = local_70.index;
      curSumCanUnify.curPosSummands._0_4_ = local_70._12_4_;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._28_8_ =
           CONCAT44(curSumCanUnify.curSum._4_4_,curSumCanUnify.curSum._0_4_);
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._36_8_ =
           CONCAT44(curSumCanUnify.curNegSummands._4_4_,(int)curSumCanUnify.curNegSummands);
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem._44_4_ =
           curSumCanUnify.curPosSummands._0_4_;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t2.term._content =
           (TermList)(TermList)local_60.term._content;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t2.index =
           local_60.index;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._isSome = true;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t1.term._content =
           (TermList)TVar3._content;
      local_240.super_OptionBase<Kernel::UnificationConstraint>._elem._elem.init._t1.index = iVar23;
    }
  }
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&_diff);
  uVar19 = NumTraits<Kernel::RationalConstantType>::addF();
  args = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::minusF();
  uVar9 = au->term;
  uVar10 = au->index;
  TVar27.index = uVar10;
  TVar27.term._content = uVar9;
  TVar27._12_4_ = 0;
  TVar27 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
           ::{lambda((auto:1)...)#1}::operator()((_lambda__auto_1______1_ *)&cTerm,args,TVar27);
  args_1._8_8_ = (AbstractingUnifier *)(TVar27._8_8_ & 0xffffffff);
  uVar11 = t1->term;
  uVar12 = t1->index;
  args_2.index = uVar12;
  args_2.term._content = uVar11;
  args_1.term._content = TVar27.term._content._content;
  args_2._12_4_ = 0;
  TVar27 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
           ::{lambda((auto:1)...)#1}::operator()
                     ((_lambda__auto_1______1_ *)&cTerm,uVar19,args_1,args_2);
  outer.term._content._4_4_ = 0;
  outer.term._content._0_4_ = TVar27.index;
  outer._8_8_ = this;
  TVar27 = norm((Kernel *)TVar27.term._content._content,outer,args_1._8_8_);
  iterAtoms<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1,auto:2)_2_>
            (TVar27.term._content._content,TVar27.index,this,
             _diff._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  curSumCanUnify.curPosSummands =
       (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        *)((*(long *)((long)_diff._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                            ._M_head_impl + 0x10) -
           *(long *)((long)_diff._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                           ._M_head_impl + 8)) / 0x30);
  curSumCanUnify.curSum._0_4_ = 0;
  curSumCanUnify.curSum._4_4_ = 0;
  curSumCanUnify.curNegSummands._0_4_ = 0;
  curSumCanUnify.curNegSummands._4_4_ = 0;
  Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  find<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_1_>
            ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)&curSumCanUnify,
             (anon_class_8_1_898ab903)
             _diff._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  pmVar25 = curSum._num._val[0]._mp_d;
  if ((char)curSum._num._val[0]._mp_alloc != '\x01') {
    pmVar25 = (mp_limb_t *)
              ((*(long *)((long)_diff._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                ._M_head_impl + 0x10) -
               *(long *)((long)_diff._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               .
                               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                               ._M_head_impl + 8)) / 0x30);
  }
  toConstr.sum = &sum;
  sum.sig = &sig;
  toConstr.constraint = &constraint;
  curSumCanUnify.unify =
       (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        *)((*(long *)((long)_diff._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                            ._M_head_impl + 0x10) -
           *(long *)((long)_diff._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                           ._M_head_impl + 8)) / 0x30);
  curSumCanUnify.curNegSummands._0_4_ = 0;
  curSumCanUnify.curNegSummands._4_4_ = 0;
  curSumCanUnify.curPosSummands._0_4_ = 0;
  curSumCanUnify.curPosSummands._4_4_ = 0;
  curSumCanUnify.curSum._0_4_ =
       _diff._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl._0_4_;
  curSumCanUnify.curSum._4_4_ =
       _diff._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl._4_4_;
  sum.cTerm = &cTerm;
  bVar18 = Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>,unsigned_long>(Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>&,unsigned_long)::{lambda(auto:1)#1},std::pair<Kernel::TermSpec,Kernel::RationalConstantType>&>>
           ::
           any<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1&)_2_>
                     ();
  if (bVar18) {
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::operator()
              ((EqualIf *)&curSumCanUnify,&equalIf);
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
    ::{lambda(auto:1&)#1}::operator()
              (&local_a0,(_lambda_auto_1___1_ *)&toConstr,
               (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               _diff._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    items._t1.index = local_a0._t1.index;
    items._t1._12_4_ = local_a0._t1._12_4_;
    items._t1.term._content = local_a0._t1.term._content;
    items._t2.term._content = local_a0._t2.term._content;
    items._t2.index = local_a0._t2.index;
    items._t2._12_4_ = local_a0._t2._12_4_;
    items._sort.term._content = local_a0._sort.term._content;
    items._sort.index = local_a0._sort.index;
    items._sort._12_4_ = local_a0._sort._12_4_;
    Lib::Stack<Kernel::UnificationConstraint>::pushMany<Kernel::UnificationConstraint>
              ((Stack<Kernel::UnificationConstraint> *)
               CONCAT44(curSumCanUnify.curPosSummands._4_4_,curSumCanUnify.curPosSummands._0_4_),
               items);
    local_120._unify._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._4_4_ =
         curSumCanUnify.curSum._4_4_;
    local_120._unify._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_4_ =
         curSumCanUnify.curSum._0_4_;
    local_120._constr._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._4_4_ =
         curSumCanUnify.curPosSummands._4_4_;
    local_120._constr._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_4_ =
         curSumCanUnify.curPosSummands._0_4_;
    curSumCanUnify.curSum._0_4_ = 0;
    curSumCanUnify.curSum._4_4_ = 0;
    curSumCanUnify.curPosSummands._0_4_ = 0;
    curSumCanUnify.curPosSummands._4_4_ = 0;
    Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(__return_storage_ptr__,&local_120);
    AbstractionOracle::EqualIf::~EqualIf(&local_120);
    paVar24 = &curSumCanUnify;
  }
  else {
    if (*(long *)((long)_diff._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                        ._M_head_impl + 0x10) !=
        *(long *)((long)_diff._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                        ._M_head_impl + 8)) {
      if (pmVar25 == (mp_limb_t *)0x0) {
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled(&unify);
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled(&constr);
        iVar23 = *(int *)(**(long **)((long)_diff._self._M_t.
                                            super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                            .
                                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                            ._M_head_impl + 8) + 8);
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled(&curPosSummands);
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled(&curNegSummands);
        RationalConstantType::RationalConstantType(&curSum,0);
        curSumCanUnify.unify = &unify;
        curSumCanUnify.sig = &sig;
        curSumCanUnify.constr = &constr;
        curSumCanUnify.sum = &sum;
        ppVar6 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                  ((long)_diff._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                         ._M_head_impl + 0x10);
        curSumCanUnify.curSum = &curSum;
        curSumCanUnify.curNegSummands = &curNegSummands;
        curSumCanUnify.curPosSummands = &curPosSummands;
        for (t_ = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                   ((long)_diff._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 8); t_ != ppVar6; t_ = t_ + 1) {
          pTVar20 = RobSubstitution::derefBound(*(RobSubstitution **)this,&t_->first);
          iVar1 = *(int *)((pTVar20->term)._content + 8);
          if (iVar1 != iVar23) {
            bVar18 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::
                     anon_class_56_7_29367afc::operator()(&curSumCanUnify);
            if (!bVar18) goto LAB_004bf18e;
            RationalConstantType::RationalConstantType((RationalConstantType *)&todo,0);
            RationalConstantType::operator=(&curSum,(RationalConstantType *)&todo);
            RationalConstantType::~RationalConstantType((RationalConstantType *)&todo);
            Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::reset
                      ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                       curPosSummands._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                       ._M_head_impl);
            Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::reset
                      ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                       curNegSummands._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                       ._M_head_impl);
            iVar23 = iVar1;
          }
          RationalConstantType::operator+=(&curSum,&t_->second);
          bVar18 = RationalConstantType::isPositive(&t_->second);
          SVar17 = curPosSummands._self;
          this_01 = curNegSummands._self;
          std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair(&local_100,t_);
          if (bVar18) {
            this_01 = SVar17;
          }
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::push
                    ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     this_01._M_t.
                     super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl,&local_100);
          RationalConstantType::~RationalConstantType(&local_100.second);
        }
        bVar18 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc
                 ::operator()(&curSumCanUnify);
        if (bVar18) {
          alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::
          operator()((EqualIf *)&shieldedVars,&equalIf);
          local_1d0._self =
               (Self)(Self)unify._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                           ._M_head_impl;
          unify._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  )0x0;
          AbstractionOracle::EqualIf::unify((EqualIf *)&todo,(EqualIf *)&shieldedVars,&local_1d0);
          local_1e0._self =
               (Self)(Self)constr._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                           ._M_head_impl;
          constr._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  )0x0;
          AbstractionOracle::EqualIf::constr
                    ((EqualIf *)(local_180 + 0x20),(EqualIf *)&todo,&local_1e0);
          Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ::Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                    (__return_storage_ptr__,(EqualIf *)(local_180 + 0x20));
          AbstractionOracle::EqualIf::~EqualIf((EqualIf *)(local_180 + 0x20));
          Lib::
          Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&local_1e0);
          AbstractionOracle::EqualIf::~EqualIf((EqualIf *)&todo);
          Lib::
          Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&local_1d0);
          AbstractionOracle::EqualIf::~EqualIf((EqualIf *)&shieldedVars);
        }
        else {
LAB_004bf18e:
          pDVar13 = &(__return_storage_ptr__->_inner).
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          ;
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0xf] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x10] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x11] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x12] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x13] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x14] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x15] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x16] = '\0';
          pDVar13 = &(__return_storage_ptr__->_inner).
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          ;
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x17] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x18] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x19] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x1a] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x1b] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x1c] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x1d] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0x1e] = '\0';
          *(undefined8 *)
           &(__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
            .
            super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
               = 0;
          pDVar13 = &(__return_storage_ptr__->_inner).
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          ;
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[7] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[8] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[9] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[10] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0xb] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0xc] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0xd] = '\0';
          (pDVar13->
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          )._content[0xe] = '\0';
          *(undefined4 *)
           ((__return_storage_ptr__->_inner).
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
            .
            super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
            ._content + 0x1f) = 0;
        }
        RationalConstantType::~RationalConstantType(&curSum);
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&curNegSummands);
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&curPosSummands);
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&constr);
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&unify);
      }
      else {
        Lib::
        Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled(&shieldedVars);
        curSumCanUnify.curPosSummands =
             (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)((*(long *)((long)_diff._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 0x10) -
                 *(long *)((long)_diff._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 8)) / 0x30);
        curSumCanUnify.curSum._0_4_ = SUB84(pmVar25,0);
        uVar14 = curSumCanUnify.curSum._0_4_;
        curSumCanUnify.curSum._4_4_ = (undefined4)((ulong)pmVar25 >> 0x20);
        uVar15 = curSumCanUnify.curSum._4_4_;
        curSumCanUnify.curNegSummands._0_4_ = curSumCanUnify.curSum._0_4_;
        curSumCanUnify.curNegSummands._4_4_ = curSumCanUnify.curSum._4_4_;
        Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::StlIter
                  ((StlIter *)&curSum,
                   (IterTraits<Lib::RangeIterator<unsigned_long>_> *)&curSumCanUnify);
        bVar26 = (byte)curSum._num._val[0]._mp_d;
        while (uVar16 = curSum._den._val[0]._0_8_, (bVar26 & 1) != 0) {
          Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          Recycled(&todo);
          elem.index = *(undefined4 *)
                        (*(long *)((long)_diff._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                         ._M_head_impl + 8) + 8 + uVar16 * 0x30);
          elem.term._content =
               *(undefined8 *)
                (*(long *)((long)_diff._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 8) + uVar16 * 0x30);
          elem._12_4_ = 0;
          Lib::Stack<Kernel::TermSpec>::push
                    ((Stack<Kernel::TermSpec> *)
                     todo._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>._M_head_impl,elem
                    );
          while (lVar4 = *(long *)((long)todo._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>
                                         ._M_head_impl + 0x10),
                lVar4 != *(long *)((long)todo._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>
                                         ._M_head_impl + 8)) {
            *(long *)((long)todo._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>.
                            _M_head_impl + 0x10) = lVar4 + -0x10;
            unify._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
                 = *(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                     *)&((__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                          *)(lVar4 + -0x10))->_M_t;
            unify._8_4_ = *(undefined4 *)(lVar4 + -8);
            pTVar20 = RobSubstitution::derefBound(*(RobSubstitution **)this,(TermSpec *)&unify);
            this_00 = todo._self;
            uVar5 = (pTVar20->term)._content;
            if ((uVar5 & 1) == 0) {
              uVar19 = TermSpec::nTermArgs(pTVar20);
              it._iter._20_4_ = uStack_1e4;
              it._iter._inner._to = uVar19;
              it._iter._inner._next = 0;
              it._iter._inner._from = 0;
              it._iter._func.this = pTVar20;
              Lib::Stack<Kernel::TermSpec>::
              loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::termArgs()const::_lambda(auto:1)_1_,Kernel::TermSpec>>>
                        ((Stack<Kernel::TermSpec> *)
                         this_00._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>._M_head_impl,
                         it);
            }
            else {
              Lib::DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert((DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)shieldedVars._self._M_t.
                        super___uniq_ptr_impl<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                        .
                        super__Head_base<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                        ._M_head_impl,uVar5,pTVar20->index);
            }
          }
          Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          ~Recycled(&todo);
          uVar5 = *(ulong *)curSum._num._val[0]._0_8_;
          bVar26 = uVar5 < *(ulong *)(curSum._num._val[0]._0_8_ + 0x10);
          if ((bool)bVar26) {
            *(ulong *)curSum._num._val[0]._0_8_ = uVar5 + 1;
            curSum._den._val[0]._0_8_ = uVar5;
          }
          curSum._num._val[0]._mp_d = (mp_limb_t *)CONCAT71(curSum._num._val[0]._mp_d._1_7_,bVar26);
        }
        curSumCanUnify.curSum._0_4_ = 0;
        curSumCanUnify.curSum._4_4_ = 0;
        curSumCanUnify.curNegSummands._0_4_ = 0;
        curSumCanUnify.curNegSummands._4_4_ = 0;
        p.diff = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)&shieldedVars;
        p.shieldedVars =
             (Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)&curSumCanUnify;
        curSumCanUnify.curPosSummands._0_4_ = uVar14;
        curSumCanUnify.curPosSummands._4_4_ = uVar15;
        Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
        find<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_3_>
                  ((IterTraits<Lib::RangeIterator<unsigned_long>> *)&unify,p);
        if ((char)unify._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                  _M_head_impl == '\x01') {
          RationalConstantType::RationalConstantType
                    (&curSum,(RationalConstantType *)
                             (*(long *)((long)_diff._self._M_t.
                                              super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                              .
                                              super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                              ._M_head_impl + 8) +
                              CONCAT44(unify._12_4_,unify._8_4_) * 0x30 + 0x10));
          curSumCanUnify.unify =
               (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)(CONCAT44(unify._12_4_,unify._8_4_) * 0x30 +
                  *(long *)((long)_diff._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 8));
          todo._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>,_true,_true>
                  )_diff._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                   ._M_head_impl;
          curSumCanUnify.curNegSummands =
               (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)&equalIf;
          curSumCanUnify.curPosSummands =
               (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)&constraint;
          curSumCanUnify.sig =
               (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&sum;
          curSumCanUnify.constr =
               (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)&todo;
          todo._8_8_ = (IterTraits<Lib::RangeIterator<unsigned_long>> *)&unify;
          curSumCanUnify.curSum = &curSum;
          alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
          ::{lambda(auto:1)#5}::operator()(&local_1a0);
          Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ::Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(__return_storage_ptr__,&local_1a0);
          AbstractionOracle::EqualIf::~EqualIf(&local_1a0);
          paVar24 = (anon_class_56_7_29367afc *)&curSum;
LAB_004bee28:
          RationalConstantType::~RationalConstantType((RationalConstantType *)paVar24);
        }
        else {
          if (pmVar25 == (mp_limb_t *)0x1) {
            p_Var7 = *(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                       **)((long)_diff._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 8);
            RationalConstantType::RationalConstantType
                      ((RationalConstantType *)&curSumCanUnify,(RationalConstantType *)(p_Var7 + 2))
            ;
            curSum._den._val[0]._0_8_ =
                 (*(long *)((long)_diff._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 0x10) -
                 *(long *)((long)_diff._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 8)) / 0x30;
            curSum._num._val[0]._mp_alloc = 1;
            curSum._num._val[0]._mp_size = 0;
            curSum._num._val[0]._mp_d = (mp_limb_t *)0x1;
            Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::StlIter
                      ((StlIter *)&todo,(IterTraits<Lib::RangeIterator<unsigned_long>_> *)&curSum);
            bVar26 = todo._8_1_;
            while ((bVar26 & 1) != 0) {
              constr._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
              _M_head_impl = *(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                               *)&p_Var7->_M_t;
              constr._8_4_ = *(undefined4 *)&p_Var7[1]._M_t;
              bVar18 = uncanellableOccursCheck
                                 ((AbstractingUnifier *)this,(VarSpec *)&constr,
                                  (TermSpec *)
                                  (local_2d0.init * 0x30 +
                                  *(long *)((long)_diff._self._M_t.
                                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                                  ._M_head_impl + 8)));
              if (bVar18) {
                pDVar13 = &(__return_storage_ptr__->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xf] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x10] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x11] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x12] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x13] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x14] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x15] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x16] = '\0';
                pDVar13 = &(__return_storage_ptr__->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x17] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x18] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x19] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1a] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1b] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1c] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1d] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1e] = '\0';
                *(undefined8 *)
                 &(__return_storage_ptr__->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                  .
                  super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                     = 0;
                pDVar13 = &(__return_storage_ptr__->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[7] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[8] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[9] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[10] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xb] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xc] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xd] = '\0';
                (pDVar13->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xe] = '\0';
                *(undefined4 *)
                 ((__return_storage_ptr__->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                  .
                  super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                  ._content + 0x1f) = 0;
                paVar24 = &curSumCanUnify;
                goto LAB_004bee28;
              }
              VVar8 = *(Value *)todo._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>.
                                _M_head_impl;
              bVar26 = VVar8.init <
                       *(ulong *)((long)todo._self._M_t.
                                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                                        .
                                        super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>
                                        ._M_head_impl + 0x10);
              if ((bool)bVar26) {
                *(unsigned_long *)
                 todo._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermSpec>,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermSpec>_*,_std::default_delete<Lib::Stack<Kernel::TermSpec>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermSpec>_*,_false>._M_head_impl =
                     VVar8.init + 1;
                local_2d0 = VVar8;
              }
              todo._8_1_ = bVar26;
            }
            RationalConstantType::~RationalConstantType((RationalConstantType *)&curSumCanUnify);
          }
          alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::
          operator()((EqualIf *)&curSumCanUnify,&equalIf);
          alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
          ::{lambda(auto:1&)#1}::operator()
                    (&local_d0,(_lambda_auto_1___1_ *)&toConstr,
                     (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     _diff._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl);
          items_00._t1.index = local_d0._t1.index;
          items_00._t1._12_4_ = local_d0._t1._12_4_;
          items_00._t1.term._content = local_d0._t1.term._content;
          items_00._t2.term._content = local_d0._t2.term._content;
          items_00._t2.index = local_d0._t2.index;
          items_00._t2._12_4_ = local_d0._t2._12_4_;
          items_00._sort.term._content = local_d0._sort.term._content;
          items_00._sort.index = local_d0._sort.index;
          items_00._sort._12_4_ = local_d0._sort._12_4_;
          Lib::Stack<Kernel::UnificationConstraint>::pushMany<Kernel::UnificationConstraint>
                    ((Stack<Kernel::UnificationConstraint> *)
                     CONCAT44(curSumCanUnify.curPosSummands._4_4_,
                              curSumCanUnify.curPosSummands._0_4_),items_00);
          local_140._unify._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _4_4_ = curSumCanUnify.curSum._4_4_;
          local_140._unify._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _0_4_ = curSumCanUnify.curSum._0_4_;
          local_140._constr._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _4_4_ = curSumCanUnify.curPosSummands._4_4_;
          local_140._constr._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _0_4_ = curSumCanUnify.curPosSummands._0_4_;
          curSumCanUnify.curSum._0_4_ = 0;
          curSumCanUnify.curSum._4_4_ = 0;
          curSumCanUnify.curPosSummands._0_4_ = 0;
          curSumCanUnify.curPosSummands._4_4_ = 0;
          Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ::Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(__return_storage_ptr__,&local_140);
          AbstractionOracle::EqualIf::~EqualIf(&local_140);
          AbstractionOracle::EqualIf::~EqualIf((EqualIf *)&curSumCanUnify);
        }
        Lib::
        Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&shieldedVars);
      }
      goto LAB_004bf298;
    }
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::operator()
              ((EqualIf *)local_180,&equalIf);
    Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(__return_storage_ptr__,(EqualIf *)local_180);
    paVar24 = (anon_class_56_7_29367afc *)local_180;
  }
  AbstractionOracle::EqualIf::~EqualIf((EqualIf *)paVar24);
LAB_004bf298:
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&_diff);
  return __return_storage_ptr__;
}

Assistant:

AbstractionOracle::AbstractionResult alasca(AbstractingUnifier& au, TermSpec const& t1, TermSpec const& t2, NumTraits n_, Options::UnificationWithAbstraction uwa) {
  TIME_TRACE("unification with abstraction ALASCA")
  AlascaSignature<NumTraits> sig;
  Option<UnificationConstraint> sortsUnif;
  auto equalIf = [&]() {
    if (sortsUnif.isSome()) {
      return AbstractionOracle::EqualIf()
                     .unify(*sortsUnif.take());
    } else {
      return AbstractionOracle::EqualIf();
    }
  };
  using AbstractionResult = AbstractionOracle::AbstractionResult;
  using NeverEqual = AbstractionOracle::NeverEqual;
  using Numeral = typename NumTraits::ConstantType;
  
  auto cTerm = [&](auto... args) { return au.subs().createTerm(args...); };
  auto constraint = [&](auto lhs, auto rhs) { return UnificationConstraint(lhs, rhs, TermSpec(sig.sort(), 0)); };

#define CHECK_SORTS(t1, t2)                                                               \
  if (t1.isTerm()) {                                                                      \
    auto s1 = au.subs().derefBound(t1.sort());                                            \
    if (s1.isVar()) {                                                                     \
      ASS(sortsUnif.isNone())                                                             \
      sortsUnif = some(UnificationConstraint(s1, TermSpec(sig.sort(), 0), TermSpec(AtomicSort::superSort(), 0))); \
    } else if (s1.term != sig.sort()) {                                                   \
      return AbstractionResult(NeverEqual{});                                             \
    }                                                                                     \
  }                                                                                       \

  CHECK_SORTS(t1, t2)
  CHECK_SORTS(t2, t1)

  Recycled<Stack<std::pair<TermSpec, Numeral>>> _diff;
  auto& diff = *_diff;
  // TODO prevent these cterm calls?
  auto dt = cTerm(sig.addF(), cTerm(sig.minusF(), t1), t2);
  auto nf = norm(std::move(dt), au);

  iterAtoms(std::move(nf), au, sig,
    [&diff](auto t, auto num) { diff.push(std::make_pair(t,  num)); });

  // TODO bin search if many elems
  auto nVars = range(0, diff.size())
    .find([&](auto i) { return !diff[i].first.isVar();  })
    .unwrapOrElse([&](){ return diff.size(); });

  ASS(nVars == 0 || diff[nVars - 1].first.isVar())
  ASS(nVars == diff.size() || !diff[nVars].first.isVar())

  auto sum = [&](auto iter) -> TermSpec {
      return iterTraits(std::move(iter))
        .map([&](auto x) { return numMul(x.second, std::move(x.first)); })
        .fold([&](auto l, auto r) 
          { return cTerm(sig.addF(), std::move(l), std::move(r)); })
        .unwrapOrElse([&]() { return TermSpec(sig.numeralTl(Numeral(0)), 0); }); };

  auto toConstr = [&](auto& stack) {
    return constraint(
              sum(arrayIter(stack)
                 .filter([](auto& x) { return x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(std::move(x.first)), x.second); })),
              sum(arrayIter(stack)
                 .filter([](auto& x) { return !x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })));
  };

  if (arrayIter(diff).any([&](auto& x) 
        { return x.first.isTerm() && NumTraits::isMul(x.first.functor()); })) {

    // non-linear multiplication. we cannot deal with this in alasca
    return AbstractionResult(equalIf().constr(toConstr(diff)));

  } else if (diff.size() == 0) {
    return AbstractionResult(equalIf());

  } else if (nVars > 0) {
     Recycled<DHSet<TermSpec>> shieldedVars;
     for (auto i : range(nVars, diff.size())) {
       Recycled<Stack<TermSpec>> todo;
       todo->push(diff[i].first);
       while (todo->isNonEmpty()) {
         auto next_ = todo->pop();
         auto& next = au.subs().derefBound(next_);
         if (next.isVar()) {
           shieldedVars->insert(next);
         } else {
           todo->loadFromIterator(next.termArgs());
         }
       }
     }
     auto idx = 
       range(0, nVars)
          .find([&](auto i) 
                { return !shieldedVars->contains(diff[i].first); });

    if (idx) {
      // we have a variable unshielded in this unification
      auto num = diff[*idx].second;
      auto& var = diff[*idx].first;
      auto rest = [&]() 
      { return range(0, diff.size())
                .filter([&](auto i) { return i != *idx; })
                .map([&](auto i) { return std::move(diff[i]); }); };

      return AbstractionResult(ifIntTraits(NumTraits{}, 
            // TODO
            [&](auto n) { return num == -1 ? equalIf().unify(constraint(std::move(var), sum(rest())))
                               : num ==  1 ? equalIf().unify(constraint(std::move(var), sum(rest().map([](auto x) { return std::make_pair(std::move(x.first), -std::move(x.second)); }))))
                               :                      equalIf().constr(constraint(numMul(-num, std::move(var)), sum(rest())))
                                                    ; },
            [&](auto n) { return equalIf().unify(constraint(std::move(var), 
                sum(rest().map([&](auto x) { return std::make_pair(std::move(x.first), divOrPanic(n, x.second, -num)); })
                  ))); }
            ));

    } else {
      // all variables are shielded

      if (nVars == 1) {
       auto& var = diff[0].first;
       auto  num = diff[0].second;

       for (auto i : range(nVars, diff.size())) {
         if (uncanellableOccursCheck(au, var.varSpec(), diff[i].first)) {
           return AbstractionResult(NeverEqual{});
         }
       }
     }
     return AbstractionResult(equalIf().constr(toConstr(diff)));
    }
  } 

  // no variables

  Recycled<Stack<UnificationConstraint>> unify;
  Recycled<Stack<UnificationConstraint>> constr;
  auto curF = diff[0].first.functor();
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curPosSummands;
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curNegSummands;
  auto curSum = Numeral(0);  


  auto curSumCanUnify = [&]() -> bool {
      if (curSum != Numeral(0)) {
        return false;

      } else if (curNegSummands->size() == 1) {
        for (auto& s : *curPosSummands) {
          unify->push(UnificationConstraint(
            (*curNegSummands)[0].first,
            std::move(s.first), 
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else if (curPosSummands->size() == 1) {
        for (auto& s : *curNegSummands) {
          unify->push(UnificationConstraint(
            (*curPosSummands)[0].first,
            std::move(s.first),
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else {
        ASS(curPosSummands->size() + curNegSummands->size() >= 3)
        constr->push(UnificationConstraint(
              sum(arrayIter(*curPosSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), x.second); })),
              sum(arrayIter(*curNegSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })),
              TermSpec(sig.sort(), 0)));
        return true;
      }
  };

  for (auto& x : diff) {
    auto f = au.subs().derefBound(x.first).functor();
    if (f != curF) {
      if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
      curF = f;
      curSum = Numeral(0);
      curPosSummands->reset();
      curNegSummands->reset();
    }
    curSum += x.second;
    (x.second.isPositive() ? curPosSummands : curNegSummands)->push(std::move(x));
  }
  if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
  return AbstractionResult(equalIf().unify(std::move(unify)).constr(std::move(constr)));
}